

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  bool _aborting;
  pointer pIVar1;
  TestRunStats local_78;
  RunContext *local_10;
  RunContext *this_local;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_003be3f8;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_003be4b8;
  local_10 = this;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  _aborting = aborting(this);
  TestRunStats::TestRunStats(&local_78,&this->m_runInfo,&this->m_totals,_aborting);
  (*pIVar1->_vptr_IStreamingReporter[0xe])(pIVar1,&local_78);
  TestRunStats::~TestRunStats(&local_78);
  FatalConditionHandler::~FatalConditionHandler(&this->m_fatalConditionhandler);
  TestCaseTracking::TrackerContext::~TrackerContext(&this->m_trackerContext);
  clara::std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~vector(&this->m_activeSections);
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            (&this->m_messageScopes);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::~unique_ptr(&this->m_reporter);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(&this->m_config);
  Option<Catch::AssertionResult>::~Option(&this->m_lastResult);
  TestRunInfo::~TestRunInfo(&this->m_runInfo);
  IRunner::~IRunner(&this->super_IRunner);
  IResultCapture::~IResultCapture(&this->super_IResultCapture);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }